

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O2

void __thiscall
Assimp::ASEImporter::InternReadFile
          (ASEImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer pLVar1;
  pointer pCVar2;
  pointer pDVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  Parser *pPVar6;
  Logger *this_00;
  aiMesh **ppaVar7;
  pointer pMVar8;
  DeadlyImportError *this_01;
  pointer pMVar9;
  uint fileFormatDefault;
  byte bVar10;
  const_iterator i;
  pointer ppaVar11;
  pointer pLVar12;
  pointer pCVar13;
  pointer pDVar14;
  ASEImporter *this_02;
  pointer ppaVar15;
  vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> nodes;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> avOutMeshes;
  vector<char,_std::allocator<char>_> mBuffer2;
  Parser parser;
  IOStream *stream;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&parser,"rb",(allocator<char> *)&avOutMeshes);
  iVar5 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,parser.filePtr);
  stream = (IOStream *)CONCAT44(extraout_var,iVar5);
  std::__cxx11::string::~string((string *)&parser);
  if (stream != (IOStream *)0x0) {
    mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    BaseImporter::TextFileToBuffer(stream,&mBuffer2,FORBID_EMPTY);
    this->mBuffer =
         mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start;
    this->pcScene = pScene;
    fileFormatDefault = 200;
    if (((pFile->_M_dataplus)._M_p[pFile->_M_string_length - 1] + 0xbdU & 0xdf) == 0) {
      fileFormatDefault = 0x6e;
    }
    ASE::Parser::Parser(&parser,mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,fileFormatDefault);
    this->mParser = &parser;
    ASE::Parser::Parse(&parser);
    pPVar6 = this->mParser;
    pMVar8 = (pPVar6->m_vMeshes).
             super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar9 = pMVar8;
    if (pMVar8 != (pPVar6->m_vMeshes).
                  super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      GenerateDefaultMaterial(this);
      this_02 = (ASEImporter *)&avOutMeshes;
      avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)this_02,
                 (((long)(this->mParser->m_vMeshes).
                         super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->mParser->m_vMeshes).
                        super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x2d0) * 2);
      pPVar6 = this->mParser;
      bVar10 = 0;
      for (pMVar8 = (pPVar6->m_vMeshes).
                    super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pMVar8 != (pPVar6->m_vMeshes).
                    super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>.
                    _M_impl.super__Vector_impl_data._M_finish; pMVar8 = pMVar8 + 1) {
        if (pMVar8->bSkip == false) {
          BuildUniqueRepresentation(this_02,pMVar8);
          bVar4 = GenerateNormals(this,pMVar8);
          this_02 = this;
          ConvertMeshes(this,pMVar8,&avOutMeshes);
          bVar10 = bVar10 | bVar4;
          pPVar6 = this->mParser;
        }
      }
      if (bVar10 != 0) {
        this_00 = DefaultLogger::get();
        Logger::debug(this_00,
                      "ASE: Taking normals from the file. Use the AI_CONFIG_IMPORT_ASE_RECONSTRUCT_NORMALS setting if you experience problems"
                     );
      }
      ppaVar15 = avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      ppaVar11 = avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pScene->mNumMeshes =
           (uint)((ulong)((long)avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
      ppaVar7 = (aiMesh **)
                operator_new__((long)avOutMeshes.
                                     super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                               (long)avOutMeshes.
                                     super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                                     .super__Vector_impl_data._M_start & 0x7fffffff8);
      pScene->mMeshes = ppaVar7;
      for (; ppaVar11 != ppaVar15; ppaVar11 = ppaVar11 + 1) {
        if ((*ppaVar11)->mNumFaces != 0) {
          *ppaVar7 = *ppaVar11;
          ppaVar7 = ppaVar7 + 1;
          ppaVar15 = avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        }
      }
      pScene->mNumMeshes = (uint)((ulong)((long)ppaVar7 - (long)pScene->mMeshes) >> 3);
      BuildMaterialIndices(this);
      std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
                (&avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>);
      pPVar6 = this->mParser;
      pMVar9 = (pPVar6->m_vMeshes).
               super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>._M_impl.
               super__Vector_impl_data._M_start;
      pMVar8 = (pPVar6->m_vMeshes).
               super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    nodes.super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    nodes.super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    nodes.super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>::reserve
              (&nodes,((long)(pPVar6->m_vCameras).
                             super__Vector_base<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pPVar6->m_vCameras).
                            super__Vector_base<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x168 +
                      ((long)(pPVar6->m_vDummies).
                             super__Vector_base<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pPVar6->m_vDummies).
                            super__Vector_base<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x158 +
                      ((long)pMVar8 - (long)pMVar9) / 0x2d0 +
                      ((long)(pPVar6->m_vLights).
                             super__Vector_base<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pPVar6->m_vLights).
                            super__Vector_base<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x170);
    pLVar1 = (this->mParser->m_vLights).
             super__Vector_base<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pLVar12 = (this->mParser->m_vLights).
                   super__Vector_base<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>.
                   _M_impl.super__Vector_impl_data._M_start; pLVar12 != pLVar1;
        pLVar12 = pLVar12 + 1) {
      avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pLVar12;
      std::vector<Assimp::ASE::BaseNode*,std::allocator<Assimp::ASE::BaseNode*>>::
      emplace_back<Assimp::ASE::BaseNode*>
                ((vector<Assimp::ASE::BaseNode*,std::allocator<Assimp::ASE::BaseNode*>> *)&nodes,
                 (BaseNode **)&avOutMeshes);
    }
    pCVar2 = (this->mParser->m_vCameras).
             super__Vector_base<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar13 = (this->mParser->m_vCameras).
                   super__Vector_base<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>.
                   _M_impl.super__Vector_impl_data._M_start; pCVar13 != pCVar2;
        pCVar13 = pCVar13 + 1) {
      avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pCVar13;
      std::vector<Assimp::ASE::BaseNode*,std::allocator<Assimp::ASE::BaseNode*>>::
      emplace_back<Assimp::ASE::BaseNode*>
                ((vector<Assimp::ASE::BaseNode*,std::allocator<Assimp::ASE::BaseNode*>> *)&nodes,
                 (BaseNode **)&avOutMeshes);
    }
    pMVar9 = (this->mParser->m_vMeshes).
             super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pMVar8 = (this->mParser->m_vMeshes).
                  super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>._M_impl.
                  super__Vector_impl_data._M_start; pMVar8 != pMVar9; pMVar8 = pMVar8 + 1) {
      avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&pMVar8->super_BaseNode;
      std::vector<Assimp::ASE::BaseNode*,std::allocator<Assimp::ASE::BaseNode*>>::
      emplace_back<Assimp::ASE::BaseNode*>
                ((vector<Assimp::ASE::BaseNode*,std::allocator<Assimp::ASE::BaseNode*>> *)&nodes,
                 (BaseNode **)&avOutMeshes);
    }
    pDVar3 = (this->mParser->m_vDummies).
             super__Vector_base<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pDVar14 = (this->mParser->m_vDummies).
                   super__Vector_base<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_>.
                   _M_impl.super__Vector_impl_data._M_start; pDVar14 != pDVar3;
        pDVar14 = pDVar14 + 1) {
      avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pDVar14;
      std::vector<Assimp::ASE::BaseNode*,std::allocator<Assimp::ASE::BaseNode*>>::
      emplace_back<Assimp::ASE::BaseNode*>
                ((vector<Assimp::ASE::BaseNode*,std::allocator<Assimp::ASE::BaseNode*>> *)&nodes,
                 (BaseNode **)&avOutMeshes);
    }
    BuildNodes(this,&nodes);
    BuildAnimations(this,&nodes);
    BuildCameras(this);
    BuildLights(this);
    if ((pScene->mNumMeshes == 0) &&
       (*(byte *)&pScene->mFlags = (byte)pScene->mFlags | 1, this->noSkeletonMesh == false)) {
      SkeletonMeshBuilder::SkeletonMeshBuilder
                ((SkeletonMeshBuilder *)&avOutMeshes,pScene,(aiNode *)0x0,false);
      SkeletonMeshBuilder::~SkeletonMeshBuilder((SkeletonMeshBuilder *)&avOutMeshes);
    }
    std::_Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>::
    ~_Vector_base(&nodes.
                   super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>
                 );
    ASE::Parser::~Parser(&parser);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&mBuffer2.super__Vector_base<char,_std::allocator<char>_>);
    (*stream->_vptr_IOStream[1])(stream);
    return;
  }
  this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&avOutMeshes,
                 "Failed to open ASE file ",pFile);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&avOutMeshes,
                 ".");
  DeadlyImportError::DeadlyImportError(this_01,(string *)&parser);
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ASEImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler) {
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == nullptr) {
        throw DeadlyImportError( "Failed to open ASE file " + pFile + ".");
    }

    // Allocate storage and copy the contents of the file to a memory buffer
    std::vector<char> mBuffer2;
    TextFileToBuffer(file.get(),mBuffer2);

    this->mBuffer = &mBuffer2[0];
    this->pcScene = pScene;

    // ------------------------------------------------------------------
    // Guess the file format by looking at the extension
    // ASC is considered to be the older format 110,
    // ASE is the actual version 200 (that is currently written by max)
    // ------------------------------------------------------------------
    unsigned int defaultFormat;
    std::string::size_type s = pFile.length()-1;
    switch (pFile.c_str()[s])   {

    case 'C':
    case 'c':
        defaultFormat = AI_ASE_OLD_FILE_FORMAT;
        break;
    default:
        defaultFormat = AI_ASE_NEW_FILE_FORMAT;
    };

    // Construct an ASE parser and parse the file
    ASE::Parser parser(mBuffer,defaultFormat);
    mParser = &parser;
    mParser->Parse();

    //------------------------------------------------------------------
    // Check whether we god at least one mesh. If we did - generate
    // materials and copy meshes.
    // ------------------------------------------------------------------
    if ( !mParser->m_vMeshes.empty())   {

        // If absolutely no material has been loaded from the file
        // we need to generate a default material
        GenerateDefaultMaterial();

        // process all meshes
        bool tookNormals = false;
        std::vector<aiMesh*> avOutMeshes;
        avOutMeshes.reserve(mParser->m_vMeshes.size()*2);
        for (std::vector<ASE::Mesh>::iterator i =  mParser->m_vMeshes.begin();i != mParser->m_vMeshes.end();++i)    {
            if ((*i).bSkip) {
                continue;
            }
            BuildUniqueRepresentation(*i);

            // Need to generate proper vertex normals if necessary
            if(GenerateNormals(*i)) {
                tookNormals = true;
            }

            // Convert all meshes to aiMesh objects
            ConvertMeshes(*i,avOutMeshes);
        }
        if (tookNormals)    {
            ASSIMP_LOG_DEBUG("ASE: Taking normals from the file. Use "
                "the AI_CONFIG_IMPORT_ASE_RECONSTRUCT_NORMALS setting if you "
                "experience problems");
        }

        // Now build the output mesh list. Remove dummies
        pScene->mNumMeshes = (unsigned int)avOutMeshes.size();
        aiMesh** pp = pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
        for (std::vector<aiMesh*>::const_iterator i =  avOutMeshes.begin();i != avOutMeshes.end();++i) {
            if (!(*i)->mNumFaces) {
                continue;
            }
            *pp++ = *i;
        }
        pScene->mNumMeshes = (unsigned int)(pp - pScene->mMeshes);

        // Build final material indices (remove submaterials and setup
        // the final list)
        BuildMaterialIndices();
    }

    // ------------------------------------------------------------------
    // Copy all scene graph nodes - lights, cameras, dummies and meshes
    // into one huge list.
    //------------------------------------------------------------------
    std::vector<BaseNode*> nodes;
    nodes.reserve(mParser->m_vMeshes.size() +mParser->m_vLights.size()
        + mParser->m_vCameras.size() + mParser->m_vDummies.size());

    // Lights
    for (auto &light : mParser->m_vLights)nodes.push_back(&light);
    // Cameras
    for (auto &camera : mParser->m_vCameras)nodes.push_back(&camera);
    // Meshes
    for (auto &mesh : mParser->m_vMeshes)nodes.push_back(&mesh);
    // Dummies
    for (auto &dummy : mParser->m_vDummies)nodes.push_back(&dummy);

    // build the final node graph
    BuildNodes(nodes);

    // build output animations
    BuildAnimations(nodes);

    // build output cameras
    BuildCameras();

    // build output lights
    BuildLights();

    // ------------------------------------------------------------------
    // If we have no meshes use the SkeletonMeshBuilder helper class
    // to build a mesh for the animation skeleton
    // FIXME: very strange results
    // ------------------------------------------------------------------
    if (!pScene->mNumMeshes)    {
        pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
        if (!noSkeletonMesh) {
            SkeletonMeshBuilder skeleton(pScene);
        }
    }
}